

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::removeItem
          (QGraphicsSceneBspTreeIndexPrivate *this,QGraphicsItem *item,bool recursive,
          bool moveToUnindexedItems)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QGraphicsItemPrivate *pQVar4;
  reference ppQVar5;
  QList<QGraphicsItem_*> *this_00;
  qsizetype qVar6;
  byte in_CL;
  byte bVar7;
  byte in_DL;
  QGraphicsItem *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  undefined4 in_stack_ffffffffffffff88;
  parameter_type in_stack_ffffffffffffff8c;
  QGraphicsSceneBspTreeIndexPrivate *in_stack_ffffffffffffff90;
  QSet<QGraphicsItem_*> *in_stack_ffffffffffffff98;
  undefined1 recursive_00;
  QGraphicsItem *in_stack_ffffffffffffffa0;
  QGraphicsSceneBspTreeIndexPrivate *in_stack_ffffffffffffffa8;
  int iVar8;
  undefined2 in_stack_ffffffffffffffc4;
  QGraphicsItem *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = in_DL & 1;
  bVar2 = in_CL & 1;
  if (in_RSI != (QGraphicsItem *)0x0) {
    pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RSI->d_ptr);
    if (pQVar4->index == -1) {
      QList<QGraphicsItem*>::removeOne<QGraphicsItem*>
                ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff90,
                 (QGraphicsItem **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      recursive_00 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
    }
    else {
      in_stack_ffffffffffffffa8 = (QGraphicsSceneBspTreeIndexPrivate *)(in_RDI + 0x150);
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RSI->d_ptr);
      QList<int>::operator<<((QList<int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RSI->d_ptr);
      ppQVar5 = QList<QGraphicsItem_*>::operator[]
                          ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff90,
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      *ppQVar5 = (QGraphicsItem *)0x0;
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RSI->d_ptr);
      pQVar4->index = -1;
      pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&in_RSI->d_ptr);
      bVar3 = QGraphicsItemPrivate::itemIsUntransformable(pQVar4);
      if (bVar3) {
        QList<QGraphicsItem*>::removeOne<QGraphicsItem*>
                  ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff90,
                   (QGraphicsItem **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        recursive_00 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
      }
      else {
        pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&in_RSI->d_ptr);
        if ((*(ulong *)&pQVar4->field_0x160 >> 0x37 & 1) == 0) {
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&in_RSI->d_ptr);
          recursive_00 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
          if (((*(ulong *)&pQVar4->field_0x160 & 0x20000) == 0) &&
             (pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       ::operator->(&in_RSI->d_ptr),
             (*(ulong *)&pQVar4->field_0x160 & 0x100000) == 0)) {
            recursive_00 = (undefined1)((ulong)(in_RDI + 0x80) >> 0x38);
            in_stack_ffffffffffffffa0 = in_RSI;
            QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
            operator->(&in_RSI->d_ptr);
            QGraphicsItemPrivate::sceneEffectiveBoundingRect
                      ((QGraphicsItemPrivate *)in_stack_ffffffffffffffa8);
            QGraphicsSceneBspTree::removeItem
                      ((QGraphicsSceneBspTree *)in_stack_ffffffffffffff90,
                       (QGraphicsItem *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (QRectF *)0xa1ec2d);
          }
        }
        else {
          *(undefined1 *)(in_RDI + 0x168) = 1;
          QSet<QGraphicsItem_*>::operator<<
                    (in_stack_ffffffffffffff98,(QGraphicsItem **)in_stack_ffffffffffffff90);
          recursive_00 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
        }
      }
    }
    invalidateSortCache(in_stack_ffffffffffffff90);
    if ((bVar2 & 1) != 0) {
      addItem(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(bool)recursive_00);
    }
    if ((bVar7 & 1) != 0) {
      iVar8 = 0;
      while( true ) {
        this_00 = (QList<QGraphicsItem_*> *)(long)iVar8;
        pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&in_RSI->d_ptr);
        qVar6 = QList<QGraphicsItem_*>::size(&pQVar4->children);
        if (qVar6 <= (long)this_00) break;
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&in_RSI->d_ptr);
        QList<QGraphicsItem_*>::at
                  (this_00,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        removeItem((QGraphicsSceneBspTreeIndexPrivate *)
                   CONCAT17(bVar7,CONCAT16(bVar2,CONCAT24(in_stack_ffffffffffffffc4,iVar8))),
                   in_stack_ffffffffffffffe8,SUB81((ulong)in_RDI >> 0x38,0),
                   SUB81((ulong)in_RDI >> 0x30,0));
        iVar8 = iVar8 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::removeItem(QGraphicsItem *item, bool recursive,
                                                   bool moveToUnindexedItems)
{
    if (!item)
        return;

    if (item->d_ptr->index != -1) {
        Q_ASSERT(item->d_ptr->index < indexedItems.size());
        Q_ASSERT(indexedItems.at(item->d_ptr->index) == item);
        Q_ASSERT(!item->d_ptr->itemDiscovered);
        freeItemIndexes << item->d_ptr->index;
        indexedItems[item->d_ptr->index] = 0;
        item->d_ptr->index = -1;

        if (item->d_ptr->itemIsUntransformable()) {
            untransformableItems.removeOne(item);
        } else if (item->d_ptr->inDestructor) {
            // Avoid virtual function calls from the destructor.
            purgePending = true;
            removedItems << item;
        } else if (!(item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                     || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren)) {
            bsp.removeItem(item, item->d_ptr->sceneEffectiveBoundingRect());
        }
    } else {
        unindexedItems.removeOne(item);
    }
    invalidateSortCache(); // ### Only do this when removing from BSP?

    Q_ASSERT(item->d_ptr->index == -1);
    Q_ASSERT(!indexedItems.contains(item));
    Q_ASSERT(!unindexedItems.contains(item));
    Q_ASSERT(!untransformableItems.contains(item));

    if (moveToUnindexedItems)
        addItem(item);

    if (recursive) {
        for (int i = 0; i < item->d_ptr->children.size(); ++i)
            removeItem(item->d_ptr->children.at(i), recursive, moveToUnindexedItems);
    }
}